

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_59::InMemoryFile::truncate(InMemoryFile *this,char *__file,__off_t __length)

{
  Exception *pEVar1;
  int extraout_EAX;
  long lVar2;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Maybe<kj::_::Mutex::Waiter_&> local_18;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffe0
            );
  pEVar1 = ((local_18.ptr)->exception).ptr.ptr;
  if (__file < pEVar1) {
    lVar2 = (*(code *)((((((local_18.ptr)->next).ptr)->next).ptr)->next).ptr)();
    (((Date *)&(local_18.ptr)->futex)->value).value = lVar2;
    memset(__file + (long)((Array<unsigned_char> *)&(local_18.ptr)->prev)->ptr,0,
           (long)((local_18.ptr)->exception).ptr.ptr - (long)__file);
  }
  else {
    if (__file <= pEVar1) goto LAB_001d5eb7;
    lVar2 = (*(code *)((((((local_18.ptr)->next).ptr)->next).ptr)->next).ptr)();
    (((Date *)&(local_18.ptr)->futex)->value).value = lVar2;
    Impl::ensureCapacity((Impl *)local_18.ptr,(size_t)__file);
  }
  ((local_18.ptr)->exception).ptr.ptr = (Exception *)__file;
LAB_001d5eb7:
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffe0);
  return extraout_EAX;
}

Assistant:

void truncate(uint64_t newSize) const override {
    auto lock = impl.lockExclusive();
    if (newSize < lock->size) {
      lock->modified();
      memset(lock->bytes.begin() + newSize, 0, lock->size - newSize);
      lock->size = newSize;
    } else if (newSize > lock->size) {
      lock->modified();
      lock->ensureCapacity(newSize);
      lock->size = newSize;
    }
  }